

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

Reg asm_load_lightud64(ASMState *as,IRIns *ir,int typecheck)

{
  MCode *pMVar1;
  Reg r2;
  Reg r2_00;
  
  if (((-1 < (char)(ir->field_1).r) || (typecheck != 0)) || (r2 = 0x80, (ir->field_1).s != '\0')) {
    r2 = ra_dest(as,ir,0xffef);
    if (typecheck != 0) {
      r2_00 = ra_scratch(as,~(1 << (r2 & 0x1f)) & 0xffef);
      asm_guardcc(as,5);
      pMVar1 = as->mcp;
      as->mcp = pMVar1 + -1;
      pMVar1[-1] = 0xfe;
      emit_rr(as,XO_ARITHi8,7,r2_00);
      pMVar1 = as->mcp;
      as->mcp = pMVar1 + -1;
      pMVar1[-1] = '/';
      emit_rr(as,XO_SHIFTi,0x80207,r2_00);
      emit_rr(as,XO_MOV,r2_00 | 0x80200,r2);
    }
  }
  return r2;
}

Assistant:

static Reg asm_load_lightud64(ASMState *as, IRIns *ir, int typecheck)
{
  if (ra_used(ir) || typecheck) {
    Reg dest = ra_dest(as, ir, RSET_GPR);
    if (typecheck) {
      Reg tmp = ra_scratch(as, rset_exclude(RSET_GPR, dest));
      asm_guardcc(as, CC_NE);
      emit_i8(as, -2);
      emit_rr(as, XO_ARITHi8, XOg_CMP, tmp);
      emit_shifti(as, XOg_SAR|REX_64, tmp, 47);
      emit_rr(as, XO_MOV, tmp|REX_64, dest);
    }
    return dest;
  } else {
    return RID_NONE;
  }
}